

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O3

void __thiscall cppcms::impl::cgi::http::async_read_some(http *this,void *p,size_t s,io_handler *h)

{
  pointer pcVar1;
  time_t tVar2;
  callback *pcVar3;
  uint uVar4;
  pointer pcVar5;
  ulong __n;
  mutable_buffer tmp;
  buffer_impl<char_*> local_58;
  
  tVar2 = time((time_t *)0x0);
  this->time_to_die_ = this->timeout_ + tVar2;
  uVar4 = this->input_body_ptr_;
  pcVar1 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pcVar5 - (long)pcVar1 == (ulong)uVar4) {
    if (pcVar5 != pcVar1) {
      (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar1;
      pcVar5 = pcVar1;
    }
    this->input_body_ptr_ = 0;
    uVar4 = 0;
  }
  if (pcVar1 == pcVar5) {
    if ((this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != pcVar1) {
      (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pcVar1 != (pointer)0x0) {
        operator_delete(pcVar1);
      }
    }
    local_58.size_ = 0;
    local_58.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<char_*>::add(&local_58,(char *)p,s);
    booster::aio::stream_socket::async_read_some
              ((mutable_buffer *)&this->socket_,(callback *)&local_58);
    if (local_58.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    __n = (long)pcVar5 - (long)(pcVar1 + uVar4);
    if (s <= __n) {
      __n = s;
    }
    memcpy(p,pcVar1 + uVar4,__n);
    uVar4 = this->input_body_ptr_ + (int)__n;
    this->input_body_ptr_ = uVar4;
    pcVar1 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pcVar5 - (long)pcVar1 == (ulong)uVar4) {
      if (pcVar5 != pcVar1) {
        (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar1;
      }
      this->input_body_ptr_ = 0;
    }
    pcVar3 = (callback *)booster::aio::basic_io_device::get_io_service();
    local_58.size_ = 0;
    local_58.entry_.ptr = (char *)std::_V2::system_category();
    booster::aio::io_service::post(pcVar3,(error_code *)h,(ulong)&local_58);
  }
  return;
}

Assistant:

virtual void async_read_some(void *p,size_t s,io_handler const &h)
		{
			update_time();
			if(input_body_ptr_==input_body_.size()) {
				input_body_.clear();
				input_body_ptr_=0;
			}
			if(!input_body_.empty()) {
				if(input_body_.size() - input_body_ptr_ < s) {
					s=input_body_.size() -  input_body_ptr_;
				}
				memcpy(p,&input_body_[input_body_ptr_],s);
				input_body_ptr_+=s;
				if(input_body_ptr_==input_body_.size()) {
					input_body_.clear();
					input_body_ptr_=0;
				}
				socket_.get_io_service().post(h,booster::system::error_code(),s);
				return;
			}
			if(input_body_.capacity()!=0) {
				std::vector<char> v;
				input_body_.swap(v);
			}
			socket_.async_read_some(io::buffer(p,s),h);
		}